

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmBitDxEa<(moira::Instr)31,(moira::Mode)2,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  undefined1 local_3c [8];
  Ea<(moira::Mode)2,_1> dst;
  Dn src;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  dst.ext3._2_2_ = op;
  Dn::Dn((Dn *)&dst.ext2,(int)(uint)op >> 9 & 7);
  Op<(moira::Mode)2,1>((Ea<(moira::Mode)2,_1> *)local_3c,this,dst.ext3._2_2_ & 7,addr);
  pSVar1 = StrWriter::operator<<(str);
  pSVar1 = StrWriter::operator<<(pSVar1,(Tab)(str->tab).raw);
  pSVar1 = StrWriter::operator<<(pSVar1,(Dn)dst.ext2);
  pSVar1 = StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,(Ea<(moira::Mode)2,_1> *)local_3c);
  return;
}

Assistant:

void
Moira::dasmBitDxEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = Dn       ( ____xxx_________(op)       );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << str.tab << src << Sep{} << dst;
}